

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O3

void __thiscall protozero::pbf_reader::skip(pbf_reader *this)

{
  char *pcVar1;
  char *pcVar2;
  uint len;
  undefined8 *puVar3;
  assert_error *this_00;
  char *pcVar4;
  long lVar5;
  pointer_____offset_0x10___ *ppuVar6;
  
  if (this->m_tag == 0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"tag() != 0 && \"call next() before calling skip()\"");
    __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
  }
  switch(this->m_wire_type) {
  case varint:
    pcVar1 = this->m_data;
    pcVar2 = this->m_end;
    if (pcVar1 != pcVar2) {
      lVar5 = 0;
      pcVar4 = pcVar1;
      do {
        if (-1 < *pcVar4) {
          if (lVar5 < 10) {
            this->m_data = pcVar4 + 1;
            return;
          }
          goto LAB_00166cfe;
        }
        pcVar4 = pcVar4 + 1;
        lVar5 = lVar5 + 1;
      } while (pcVar4 != pcVar2);
    }
    if ((long)pcVar2 - (long)pcVar1 < 10) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_001a8788;
      ppuVar6 = &end_of_buffer_exception::typeinfo;
    }
    else {
LAB_00166cfe:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_001a8760;
      ppuVar6 = &varint_too_long_exception::typeinfo;
    }
    __cxa_throw(puVar3,ppuVar6,std::exception::~exception);
  case fixed64:
    len = 8;
    break;
  case length_delimited:
    len = get_varint<unsigned_int>(this);
    break;
  default:
    return;
  case fixed32:
    len = 4;
  }
  skip_bytes(this,len);
  return;
}

Assistant:

void skip() {
        protozero_assert(tag() != 0 && "call next() before calling skip()");
        switch (wire_type()) {
            case pbf_wire_type::varint:
                skip_varint(&m_data, m_end);
                break;
            case pbf_wire_type::fixed64:
                skip_bytes(8);
                break;
            case pbf_wire_type::length_delimited:
                skip_bytes(get_length());
                break;
            case pbf_wire_type::fixed32:
                skip_bytes(4);
                break;
            default:
                break;
        }
    }